

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr **ppPVar1;
  uint uVar2;
  PgHdr *pPVar3;
  PgHdr *pPVar4;
  PgHdr *pPVar5;
  PgHdr *pPVar6;
  long lVar7;
  PgHdr *pPVar8;
  PgHdr *pPVar9;
  PgHdr result;
  PgHdr PStack_168;
  PgHdr *local_118 [33];
  
  pPVar5 = pCache->pDirty;
  pPVar3 = pPVar5;
  if (pPVar5 == (PgHdr *)0x0) {
    pPVar3 = (PgHdr *)0x0;
    memset(local_118,0,0x100);
  }
  else {
    do {
      pPVar8 = pPVar3->pDirtyNext;
      pPVar3->pDirty = pPVar8;
      pPVar3 = pPVar8;
    } while (pPVar8 != (PgHdr *)0x0);
    memset(local_118,0,0x100);
    pPVar3 = (PgHdr *)0x0;
joined_r0x00138121:
    if (pPVar5 != (PgHdr *)0x0) {
      pPVar3 = pPVar5->pDirty;
      pPVar5->pDirty = (PgHdr *)0x0;
      lVar7 = 0;
      do {
        pPVar8 = &PStack_168;
        pPVar9 = local_118[lVar7];
        if (local_118[lVar7] == (PgHdr *)0x0) {
          local_118[lVar7] = pPVar5;
          pPVar5 = pPVar3;
          pPVar3 = local_118[0];
          goto joined_r0x00138121;
        }
        do {
          pPVar6 = pPVar9;
          uVar2 = pPVar6->pgno;
          while (pPVar5->pgno <= uVar2) {
            pPVar8->pDirty = pPVar5;
            ppPVar1 = &pPVar5->pDirty;
            pPVar4 = pPVar6;
            pPVar8 = pPVar5;
            pPVar5 = *ppPVar1;
            if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0013818b;
          }
          pPVar8->pDirty = pPVar6;
          pPVar4 = pPVar5;
          pPVar8 = pPVar6;
          pPVar9 = pPVar6->pDirty;
        } while (pPVar6->pDirty != (PgHdr *)0x0);
LAB_0013818b:
        pPVar8->pDirty = pPVar4;
        local_118[lVar7] = (PgHdr *)0x0;
        lVar7 = lVar7 + 1;
        pPVar5 = PStack_168.pDirty;
        pPVar8 = &PStack_168;
        pPVar9 = local_118[0x1f];
      } while (lVar7 != 0x1f);
      do {
        uVar2 = pPVar9->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar8->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar6 = pPVar9;
          pPVar8 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_001381f7;
        }
        pPVar8->pDirty = pPVar9;
        ppPVar1 = &pPVar9->pDirty;
        pPVar6 = pPVar5;
        pPVar8 = pPVar9;
        pPVar9 = *ppPVar1;
      } while (*ppPVar1 != (PgHdr *)0x0);
LAB_001381f7:
      pPVar8->pDirty = pPVar6;
      local_118[0x1f] = PStack_168.pDirty;
      pPVar5 = pPVar3;
      pPVar3 = local_118[0];
      goto joined_r0x00138121;
    }
  }
  lVar7 = 1;
  do {
    pPVar5 = local_118[lVar7];
    pPVar8 = pPVar3;
    if ((pPVar5 != (PgHdr *)0x0) && (pPVar8 = pPVar5, pPVar9 = &PStack_168, pPVar3 != (PgHdr *)0x0))
    {
      do {
        pPVar8 = pPVar3;
        uVar2 = pPVar8->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar9->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar6 = pPVar8;
          pPVar9 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_00138285;
        }
        pPVar9->pDirty = pPVar8;
        pPVar6 = pPVar5;
        pPVar3 = pPVar8->pDirty;
        pPVar9 = pPVar8;
      } while (pPVar8->pDirty != (PgHdr *)0x0);
LAB_00138285:
      pPVar9->pDirty = pPVar6;
      pPVar8 = PStack_168.pDirty;
    }
    lVar7 = lVar7 + 1;
    pPVar3 = pPVar8;
    if (lVar7 == 0x20) {
      return pPVar8;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}